

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_repeat(string *str,size_t n)

{
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_t i;
  string *result;
  char *local_38;
  allocator<char> *in_stack_ffffffffffffffe0;
  
  if (in_RDX == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    std::__cxx11::string::length();
    std::__cxx11::string::reserve((ulong)in_RDI);
    for (local_38 = (char *)0x0; local_38 < in_RDX; local_38 = local_38 + 1) {
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)in_RSI);
    }
  }
  return in_RDI;
}

Assistant:

std::string string_repeat(const std::string & str, size_t n) {
    if (n == 0) {
        return "";
    }

    std::string result;
    result.reserve(str.length() * n);

    for (size_t i = 0; i < n; ++i) {
        result += str;
    }

    return result;
}